

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::SamplerLODCase::test
          (SamplerLODCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  TesterType tester;
  QueryType QVar1;
  TestLog *pTVar2;
  bool bVar3;
  bool bVar4;
  deUint32 dVar5;
  GLenum GVar6;
  int param;
  int iVar7;
  uint expected;
  float fVar8;
  GLint ref;
  allocator<char> local_119;
  ResultCollector *local_118;
  code *local_110;
  GLenum local_108;
  float local_fc;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  ScopedLogSection section;
  string local_98;
  int local_74;
  float local_70;
  float local_6c;
  string local_68;
  ScopedLogSection section_1;
  Random rnd;
  
  tester = (this->super_SamplerTest).m_tester;
  local_118 = result;
  bVar3 = isPureIntTester(tester);
  bVar4 = true;
  if (!bVar3) {
    bVar4 = isPureUintTester(tester);
  }
  GVar6 = (this->super_SamplerTest).m_pname;
  QVar1 = (this->super_SamplerTest).m_type;
  expected = 0xfffffc18;
  if (GVar6 != 0x813a) {
    expected = -(uint)(GVar6 != 0x813b) | 1000;
  }
  if ((bVar4 == false) &&
     (GVar6 == 0x813b ||
      QVar1 != QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER &&
      QVar1 != QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER)) {
    pTVar2 = ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"Initial",(allocator<char> *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"Initial",(allocator<char> *)&local_68);
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,&local_98,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_98);
    StateQueryUtil::verifyStateSamplerParamInteger
              (local_118,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
               expected,(this->super_SamplerTest).m_type);
    tcu::ScopedLogSection::~ScopedLogSection(&section);
  }
  pTVar2 = ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Set",(allocator<char> *)&section);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"Set",(allocator<char> *)&local_d8);
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar2,&local_98,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_98);
  deRandom_init(&rnd.m_rnd,0xabcdef);
  if (bVar4 == false) {
    QVar1 = (this->super_SamplerTest).m_type;
    local_74 = -1000;
    if (QVar1 == QUERY_SAMPLER_PARAM_PURE_UNSIGNED_INTEGER) {
      local_74 = 0;
    }
    if (QVar1 == QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER) {
      local_74 = 0;
    }
    local_6c = (float)local_74;
    iVar7 = 0x14;
    local_70 = 1000.0 - local_6c;
    while (bVar3 = iVar7 != 0, iVar7 = iVar7 + -1, bVar3) {
      fVar8 = deRandom_getFloat(&rnd.m_rnd);
      local_fc = fVar8 * local_70 + local_6c;
      glu::CallLogWrapper::glSamplerParameterf
                (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,local_fc);
      GVar6 = glu::CallLogWrapper::glGetError(gl);
      if (GVar6 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,"Got Error ",(allocator<char> *)&ref);
        local_110 = glu::getErrorName;
        local_108 = GVar6;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_68,&local_110);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section
                       ,&local_d8,&local_68);
        std::operator+(&local_f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section
                       ,": ");
        std::operator+(&local_98,&local_f8,"glSamplerParameterf");
        tcu::ResultCollector::fail(local_118,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&section);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_d8);
      }
      StateQueryUtil::verifyStateSamplerParamFloat
                (local_118,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 local_fc,(this->super_SamplerTest).m_type);
    }
    iVar7 = 0x14;
    while (bVar3 = iVar7 != 0, iVar7 = iVar7 + -1, bVar3) {
      param = de::Random::getInt(&rnd,local_74,1000);
      glu::CallLogWrapper::glSamplerParameteri
                (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,param);
      GVar6 = glu::CallLogWrapper::glGetError(gl);
      if (GVar6 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,"Got Error ",(allocator<char> *)&ref);
        local_110 = glu::getErrorName;
        local_108 = GVar6;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_68,&local_110);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section
                       ,&local_d8,&local_68);
        std::operator+(&local_f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&section
                       ,": ");
        std::operator+(&local_98,&local_f8,"glSamplerParameteri");
        tcu::ResultCollector::fail(local_118,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&section);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_d8);
      }
      StateQueryUtil::verifyStateSamplerParamFloat
                (local_118,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 (float)param,(this->super_SamplerTest).m_type);
    }
  }
  else {
    bVar3 = isPureIntTester((this->super_SamplerTest).m_tester);
    iVar7 = 0x14;
    if (bVar3) {
      while (bVar3 = iVar7 != 0, iVar7 = iVar7 + -1, bVar3) {
        dVar5 = deRandom_getUint32(&rnd.m_rnd);
        ref = dVar5 % 0x7d1 - 1000;
        glu::CallLogWrapper::glSamplerParameterIiv
                  (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,&ref);
        GVar6 = glu::CallLogWrapper::glGetError(gl);
        if (GVar6 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,"Got Error ",&local_119);
          local_110 = glu::getErrorName;
          local_108 = GVar6;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_68,&local_110);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &section,&local_d8,&local_68);
          std::operator+(&local_f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &section,": ");
          std::operator+(&local_98,&local_f8,"glSamplerParameterIiv");
          tcu::ResultCollector::fail(local_118,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&section);
          std::__cxx11::string::~string((string *)&local_68);
          std::__cxx11::string::~string((string *)&local_d8);
        }
        StateQueryUtil::verifyStateSamplerParamFloat
                  (local_118,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname
                   ,(float)ref,(this->super_SamplerTest).m_type);
      }
    }
    else {
      while (bVar3 = iVar7 != 0, iVar7 = iVar7 + -1, bVar3) {
        dVar5 = deRandom_getUint32(&rnd.m_rnd);
        ref = dVar5 % 0x3e9;
        glu::CallLogWrapper::glSamplerParameterIuiv
                  (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                   (GLuint *)&ref);
        GVar6 = glu::CallLogWrapper::glGetError(gl);
        if (GVar6 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,"Got Error ",&local_119);
          local_110 = glu::getErrorName;
          local_108 = GVar6;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_68,&local_110);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &section,&local_d8,&local_68);
          std::operator+(&local_f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &section,": ");
          std::operator+(&local_98,&local_f8,"glSamplerParameterIuiv");
          tcu::ResultCollector::fail(local_118,&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&section);
          std::__cxx11::string::~string((string *)&local_68);
          std::__cxx11::string::~string((string *)&local_d8);
        }
        StateQueryUtil::verifyStateSamplerParamFloat
                  (local_118,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname
                   ,(float)(uint)ref,(this->super_SamplerTest).m_type);
      }
    }
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section_1);
  return;
}

Assistant:

void SamplerLODCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool	isPureCase		= isPureIntTester(m_tester) || isPureUintTester(m_tester);
	const int	initialValue	= (m_pname == GL_TEXTURE_MIN_LOD) ? (-1000)
								: (m_pname == GL_TEXTURE_MAX_LOD) ? (1000)
								: (-1);

	if ((querySupportsSigned(m_type) || initialValue >= 0) && !isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, initialValue, m_type);
	}

	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const int					numIterations	= 20;
		de::Random					rnd				(0xabcdef);

		if (isPureCase)
		{
			if (isPureIntTester(m_tester))
			{
				for (int ndx = 0; ndx < numIterations; ++ndx)
				{
					const GLint ref = rnd.getInt(-1000, 1000);

					gl.glSamplerParameterIiv(m_target, m_pname, &ref);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIiv");

					verifyStateSamplerParamFloat(result, gl, m_target, m_pname, (float)ref, m_type);
				}
			}
			else
			{
				DE_ASSERT(isPureUintTester(m_tester));

				for (int ndx = 0; ndx < numIterations; ++ndx)
				{
					const GLuint ref = (glw::GLuint)rnd.getInt(0, 1000);

					gl.glSamplerParameterIuiv(m_target, m_pname, &ref);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIuiv");

					verifyStateSamplerParamFloat(result, gl, m_target, m_pname, (float)ref, m_type);
				}
			}
		}
		else
		{
			const int minLimit = (querySupportsSigned(m_type)) ? (-1000) : (0);

			for (int ndx = 0; ndx < numIterations; ++ndx)
			{
				const GLfloat ref = rnd.getFloat((float)minLimit, 1000.f);

				gl.glSamplerParameterf(m_target, m_pname, ref);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterf");

				verifyStateSamplerParamFloat(result, gl, m_target, m_pname, ref, m_type);
			}

			// check unit conversions with int

			for (int ndx = 0; ndx < numIterations; ++ndx)
			{
				const GLint ref = rnd.getInt(minLimit, 1000);

				gl.glSamplerParameteri(m_target, m_pname, ref);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameteri");

				verifyStateSamplerParamFloat(result, gl, m_target, m_pname, (float)ref, m_type);
			}
		}
	}
}